

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::SerializeToTXT(Model *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  index_t iVar4;
  ostream *poVar5;
  undefined8 in_RSI;
  char *in_RDI;
  index_t s;
  index_t d_1;
  index_t f;
  index_t j_1;
  real_t *w_1;
  index_t k_aligned_1;
  index_t skip;
  index_t d;
  index_t j;
  real_t *w;
  index_t k_aligned;
  index_t i;
  index_t idx;
  ofstream o_file;
  Logger *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  LogSeverity severity;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  float *local_2a8;
  uint local_298;
  uint local_294;
  float *local_290;
  uint local_280;
  uint local_27c;
  ostream local_278 [519];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  undefined8 local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  iVar3 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  local_10 = in_RSI;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) != 1) {
    std::ofstream::ofstream(local_278,local_10,0x10);
    poVar5 = std::operator<<(local_278,"bias: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,**(float **)(in_RDI + 0x68));
    std::operator<<(poVar5,"\n");
    local_27c = 0;
    for (local_280 = 0; local_280 < *(uint *)(in_RDI + 0x40);
        local_280 = *(int *)(in_RDI + 0x54) + local_280) {
      poVar5 = std::operator<<(local_278,"i_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_27c);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(float *)(*(long *)(in_RDI + 0x58) + (ulong)local_280 * 4));
      std::operator<<(poVar5,"\n");
      local_27c = local_27c + 1;
    }
    iVar3 = std::__cxx11::string::compare(in_RDI);
    if (iVar3 == 0) {
      iVar4 = get_aligned_k((Model *)0x147781);
      local_290 = *(float **)(in_RDI + 0x60);
      for (local_294 = 0; local_294 < *(uint *)(in_RDI + 0x48); local_294 = local_294 + 1) {
        poVar5 = std::operator<<(local_278,"v_");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_294);
        std::operator<<(poVar5,": ");
        for (local_298 = 0; local_298 < *(uint *)(in_RDI + 0x50); local_298 = local_298 + 1) {
          std::ostream::operator<<(local_278,*local_290);
          if (local_298 != *(int *)(in_RDI + 0x50) - 1U) {
            std::operator<<(local_278," ");
          }
          local_290 = local_290 + 1;
        }
        std::operator<<(local_278,"\n");
        local_290 = local_290 + (*(int *)(in_RDI + 0x54) * iVar4 - *(int *)(in_RDI + 0x50));
      }
    }
    iVar3 = std::__cxx11::string::compare(in_RDI);
    if (iVar3 == 0) {
      iVar4 = get_aligned_k((Model *)0x14793b);
      local_2a8 = *(float **)(in_RDI + 0x60);
      for (local_2ac = 0; local_2ac < *(uint *)(in_RDI + 0x48); local_2ac = local_2ac + 1) {
        for (local_2b0 = 0; local_2b0 < *(uint *)(in_RDI + 0x4c); local_2b0 = local_2b0 + 1) {
          poVar5 = std::operator<<(local_278,"v_");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2ac);
          poVar5 = std::operator<<(poVar5,"_");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2b0);
          std::operator<<(poVar5,": ");
          local_2b4 = 0;
          while (local_2b4 < iVar4) {
            for (local_2b8 = 0; local_2b8 < 4; local_2b8 = local_2b8 + 1) {
              if ((local_2b4 < *(uint *)(in_RDI + 0x50)) &&
                 (std::ostream::operator<<(local_278,*local_2a8),
                 local_2b4 != *(int *)(in_RDI + 0x50) - 1U)) {
                std::operator<<(local_278," ");
              }
              local_2a8 = local_2a8 + 1;
              local_2b4 = local_2b4 + 1;
            }
            local_2a8 = local_2a8 + (uint)((*(int *)(in_RDI + 0x54) + -1) * 4);
          }
          std::operator<<(local_278,"\n");
        }
      }
    }
    std::ofstream::~ofstream(local_278);
    return;
  }
  Logger::Logger(&local_14,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"SerializeToTXT",&local_71);
  poVar5 = Logger::Start(severity,in_stack_fffffffffffffcd8,iVar3,in_stack_fffffffffffffcc8);
  poVar5 = std::operator<<(poVar5,"CHECK_NE failed ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xef);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"filename.empty()");
  poVar5 = std::operator<<(poVar5," = ");
  bVar2 = (bool)std::__cxx11::string::empty();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"true");
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,true);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Logger::~Logger(in_stack_fffffffffffffc60);
  abort();
}

Assistant:

void Model::SerializeToTXT(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  std::ofstream o_file(filename);
  /*********************************************************
   *  Write linear and bias term                      *
   *********************************************************/
  // bias term
  o_file << "bias: " << param_b_[0] << "\n";
  // linear term
  index_t idx = 0;
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    o_file << "i_" << idx << ": " << param_w_[i] << "\n";
    idx++;
  }
  /*********************************************************
   *  Write latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      o_file << "v_" << j << ": ";
      for(index_t d = 0; d < num_K_; d++, w++) {
        o_file << *w;
        if (d != num_K_-1) {
          o_file << " ";
        }
      }
      o_file << "\n";
      // skip the rest parameters
      index_t skip = aux_size_*k_aligned-num_K_;
      w += skip;
    }
  }
  /*********************************************************
   *  Write latent factor for ffm                     *
   *********************************************************/
  if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        o_file << "v_" << j << "_" << f << ": ";
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            if (d < num_K_) {
              o_file << w[0];
              if (d != num_K_-1) {
                o_file << " ";
              }
            }
          }
          w += (aux_size_-1) * kAlign;
        }
        o_file << "\n";
      }
    }
  }
}